

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall estl::shared_ptr<MyClass>::control_block::dbg(control_block *this)

{
  __int_type _Var1;
  ostream *poVar2;
  control_block *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"*** FIXMENM use count: ");
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int((__atomic_base *)this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2," control count: ");
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                    ((__atomic_base *)&this->control_block_count_);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,",  this: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void dbg() {
            std::cerr << "*** FIXMENM use count: " << use_count_ << " control count: " << control_block_count_ <<  ",  this: " << this << "\n";
        }